

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::clara::detail::ExeName::ExeName(ExeName *this,string *ref)

{
  __shared_ptr<Catch::clara::detail::BoundValueRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_20;
  
  ExeName(this);
  ::std::
  make_shared<Catch::clara::detail::BoundValueRef<std::__cxx11::string>,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20);
  ::std::__shared_ptr<Catch::clara::detail::BoundValueRefBase,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Catch::clara::detail::BoundValueRefBase,(__gnu_cxx::_Lock_policy)2> *)
             &this->m_ref,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

explicit ExeName( std::string &ref ) : ExeName() {
            m_ref = std::make_shared<BoundValueRef<std::string>>( ref );
        }